

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

char * mp_get_decimal(mp_int *x_orig)

{
  BignumInt *pBVar1;
  mp_int *x;
  mp_int *x_00;
  mp_int *x_01;
  ulong uVar2;
  char *buf;
  int iVar3;
  long lVar4;
  size_t i;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  bool bVar10;
  
  x = mp_copy(x_orig);
  x_00 = mp_make_sized(x->nw);
  x_01 = mp_make_sized(x->nw);
  sVar9 = x_01->nw;
  pBVar1 = x_01->w;
  for (sVar5 = 0; sVar9 != sVar5; sVar5 = sVar5 + 1) {
    pBVar1[sVar5] = 0xcccccccccccccccc;
  }
  *pBVar1 = *pBVar1 + 1;
  if (x->nw < 0x70381c0e07038) {
    uVar2 = (x->nw * 0x2480) / 0x1e5;
    sVar9 = uVar2 + (uVar2 == 0);
    buf = (char *)safemalloc(sVar9 + 2,1,0);
    lVar8 = sVar9 + 1;
    buf[sVar9 + 1] = '\0';
    while( true ) {
      bVar10 = lVar8 == 0;
      lVar8 = lVar8 + -1;
      if (bVar10) {
        mp_free(x);
        mp_free(x_00);
        mp_free(x_01);
        trim_leading_zeroes(buf,sVar9 + 2,sVar9);
        return buf;
      }
      uVar7 = 0;
      uVar6 = 0;
      iVar3 = 1;
      for (sVar5 = 0; sVar5 != x->nw; sVar5 = sVar5 + 1) {
        for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
          uVar7 = ((uint)(x->w[sVar5] >> ((byte)lVar4 & 0x3f)) & 0xff) * iVar3 + uVar7;
          uVar6 = uVar6 + iVar3 * 0xff;
          iVar3 = 6;
        }
        if (0xffffd02f < uVar6) {
          uVar7 = (uVar7 >> 0x10) * 6 + (uVar7 & 0xffff);
          uVar6 = (uVar6 & 0xffff) + 0x5fffa;
        }
        iVar3 = 6;
      }
      iVar3 = (int)((ulong)uVar7 * 0x19999999 >> 0x20) * -10;
      uVar7 = (uVar7 + iVar3 + 6 >> 4) * -10 + iVar3 + uVar7;
      if (9 < uVar7) break;
      buf[lVar8] = (byte)uVar7 | 0x30;
      mp_sub_integer_into(x,x,(ulong)uVar7);
      mp_rshift_fixed_into(x_00,x,1);
      mp_mul_into(x,x_00,x_01);
    }
    __assert_fail("low_digit < 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x214,"char *mp_get_decimal(mp_int *)");
  }
  __assert_fail("x->nw < (~(size_t)1) / (146 * BIGNUM_INT_BITS)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x1e0,"char *mp_get_decimal(mp_int *)");
}

Assistant:

char *mp_get_decimal(mp_int *x_orig)
{
    mp_int *x = mp_copy(x_orig), *y = mp_make_sized(x->nw);

    /*
     * The inverse of 5 mod 2^lots is 0xccccccccccccccccccccd, for an
     * appropriate number of 'c's. Manually construct an integer the
     * right size.
     */
    mp_int *inv5 = mp_make_sized(x->nw);
    assert(BIGNUM_INT_BITS % 8 == 0);
    for (size_t i = 0; i < inv5->nw; i++)
        inv5->w[i] = BIGNUM_INT_MASK / 5 * 4;
    inv5->w[0]++;

    /*
     * 146/485 is an upper bound (and also a continued-fraction
     * convergent) of log10(2), so this is a conservative estimate of
     * the number of decimal digits needed to store a value that fits
     * in this many binary bits.
     */
    assert(x->nw < (~(size_t)1) / (146 * BIGNUM_INT_BITS));
    size_t bufsize = size_t_max(x->nw * (146 * BIGNUM_INT_BITS) / 485, 1) + 2;
    char *outbuf = snewn(bufsize, char);
    outbuf[bufsize - 1] = '\0';

    /*
     * Loop over the number generating digits from the least
     * significant upwards, so that we write to outbuf in reverse
     * order.
     */
    for (size_t pos = bufsize - 1; pos-- > 0 ;) {
        /*
         * Find the current residue mod 10. We do this by first
         * summing the bytes of the number, with all but the lowest
         * one multiplied by 6 (because 256^i == 6 mod 10 for all
         * i>0). That gives us a single word congruent mod 10 to the
         * input number, and then we reduce it further by manual
         * multiplication and shifting, just in case the compiler
         * target implements the C division operator in a way that has
         * input-dependent timing.
         */
        uint32_t low_digit = 0, maxval = 0, mult = 1;
        for (size_t i = 0; i < x->nw; i++) {
            for (unsigned j = 0; j < BIGNUM_INT_BYTES; j++) {
                low_digit += mult * (0xFF & (x->w[i] >> (8*j)));
                maxval += mult * 0xFF;
                mult = 6;
            }
            /*
             * For _really_ big numbers, prevent overflow of t by
             * periodically folding the top half of the accumulator
             * into the bottom half, using the same rule 'multiply by
             * 6 when shifting down by one or more whole bytes'.
             */
            if (maxval > UINT32_MAX - (6 * 0xFF * BIGNUM_INT_BYTES)) {
                low_digit = (low_digit & 0xFFFF) + 6 * (low_digit >> 16);
                maxval = (maxval & 0xFFFF) + 6 * (maxval >> 16);
            }
        }

        /*
         * Final reduction of low_digit. We multiply by 2^32 / 10
         * (that's the constant 0x19999999) to get a 64-bit value
         * whose top 32 bits are the approximate quotient
         * low_digit/10; then we subtract off 10 times that; and
         * finally we do one last trial subtraction of 10 by adding 6
         * (which sets bit 4 if the number was just over 10) and then
         * testing bit 4.
         */
        low_digit -= 10 * ((0x19999999ULL * low_digit) >> 32);
        low_digit -= 10 * ((low_digit + 6) >> 4);

        assert(low_digit < 10);        /* make sure we did reduce fully */
        outbuf[pos] = '0' + low_digit;

        /*
         * Now subtract off that digit, divide by 2 (using a right
         * shift) and by 5 (using the modular inverse), to get the
         * next output digit into the units position.
         */
        mp_sub_integer_into(x, x, low_digit);
        mp_rshift_fixed_into(y, x, 1);
        mp_mul_into(x, y, inv5);
    }

    mp_free(x);
    mp_free(y);
    mp_free(inv5);

    trim_leading_zeroes(outbuf, bufsize, bufsize - 2);
    return outbuf;
}